

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O3

cl_program
clLinkProgram(cl_context context,cl_uint num_devices,cl_device_id *device_list,char *options,
             cl_uint num_input_programs,cl_program *input_programs,
             _func_void_cl_program_void_ptr *pfn_notify,void *user_data,cl_int *errcode_ret)

{
  CTracker *pCVar1;
  uint uVar2;
  CLIntercept *this;
  cl_program *pp_Var3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  undefined7 extraout_var;
  cl_program program;
  cl_api_clLinkProgram p_Var7;
  time_point end;
  mapped_type *pmVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  ulong uVar11;
  cl_program p_Var12;
  char *options_00;
  char *local_98;
  undefined4 local_8c;
  cl_device_id *local_88;
  time_point local_80;
  char *local_78;
  cl_int localErrorCode;
  time_point local_68;
  __int_type local_60;
  cl_program *local_58;
  undefined1 local_50 [32];
  
  this = g_pIntercept;
  if ((g_pIntercept == (CLIntercept *)0x0) ||
     ((g_pIntercept->m_Dispatch).clLinkProgram == (cl_api_clLinkProgram)0x0)) {
    if (errcode_ret != (cl_int *)0x0) {
      *errcode_ret = -0x22;
    }
    return (cl_program)0x0;
  }
  local_60 = (g_pIntercept->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  local_98 = (char *)0x0;
  local_88 = device_list;
  local_58 = input_programs;
  if ((g_pIntercept->m_Config).AppendLinkOptions._M_string_length == 0) {
    uVar11 = 0;
  }
  else {
    bVar4 = CLIntercept::appendBuildOptions
                      (g_pIntercept,(g_pIntercept->m_Config).AppendLinkOptions._M_dataplus._M_p,
                       options,&local_98);
    uVar11 = CONCAT71(extraout_var,bVar4) & 0xffffffff;
  }
  uVar10 = (undefined4)uVar11;
  if (((this->m_Config).RelaxAllocationLimits == true) &&
     (bVar4 = CLIntercept::checkRelaxAllocationLimitsSupport(this,num_devices,local_88), bVar4)) {
    bVar4 = CLIntercept::appendBuildOptions
                      (this,"-cl-intel-greater-than-4GB-buffer-required",options,&local_98);
    uVar10 = (undefined4)CONCAT71((int7)(uVar11 >> 8),(byte)uVar11 | bVar4);
  }
  bVar5 = (this->m_Config).CallLogging;
  if ((bool)bVar5 == true) {
    CLIntercept::callLoggingEnter
              (this,"clLinkProgram",local_60,(cl_kernel)0x0,
               "context = %p, num_input_programs = %u, pfn_notify = %p",context,
               (ulong)num_input_programs,pfn_notify);
    bVar5 = (this->m_Config).CallLogging;
  }
  localErrorCode = 0;
  if ((((bVar5 & 1) == 0) && ((this->m_Config).ErrorLogging == false)) &&
     ((this->m_Config).ErrorAssert == false)) {
    if ((errcode_ret == (cl_int *)0x0) && ((this->m_Config).NoErrors != false)) {
LAB_001121cc:
      errcode_ret = &localErrorCode;
    }
  }
  else if (errcode_ret == (cl_int *)0x0) goto LAB_001121cc;
  if ((this->m_Config).BuildLogging == true) {
    local_68.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  else {
    local_68.__d.__r = (duration)0;
  }
  local_8c = uVar10;
  local_78 = options;
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_80.__d.__r = (duration)0;
  }
  else {
    local_80.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  pp_Var3 = local_58;
  p_Var7 = (this->m_Dispatch).clLinkProgram;
  if (local_98 == (char *)0x0) {
LAB_0011228d:
    program = (*p_Var7)(context,num_devices,local_88,local_78,num_input_programs,pp_Var3,pfn_notify,
                        user_data,errcode_ret);
  }
  else {
    program = (*p_Var7)(context,num_devices,local_88,local_98,num_input_programs,local_58,pfn_notify
                        ,user_data,errcode_ret);
    if (program == (cl_program)0x0) {
      p_Var7 = (this->m_Dispatch).clLinkProgram;
      goto LAB_0011228d;
    }
  }
  p_Var12 = (cl_program)errcode_ret;
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
    options_00 = local_78;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    options_00 = local_78;
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= local_60 &&
        (local_60 <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      p_Var12 = (cl_program)(local_50 + 0x10);
      local_50._0_8_ = p_Var12;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
      CLIntercept::updateHostTimingStats(this,"clLinkProgram",(string *)local_50,local_80,end);
      if ((cl_program)local_50._0_8_ != p_Var12) {
        operator_delete((void *)local_50._0_8_);
      }
    }
  }
  if ((this->m_Config).ErrorLogging == false) {
    bVar5 = (this->m_Config).ErrorAssert;
    if ((((bool)bVar5 == false) && ((this->m_Config).NoErrors != true)) || (*errcode_ret == 0))
    goto LAB_001123b5;
  }
  else {
    if (*errcode_ret == 0) goto LAB_001123b5;
    CLIntercept::logError(this,"clLinkProgram",*errcode_ret);
    bVar5 = (this->m_Config).ErrorAssert;
  }
  if ((bVar5 & 1) != 0) {
    raise(5);
  }
  if ((this->m_Config).NoErrors == true) {
    *errcode_ret = 0;
  }
LAB_001123b5:
  if ((this->m_Config).BuildLogging == true) {
    CLIntercept::logBuild(this,local_68,program,num_devices,local_88);
  }
  if ((program != (cl_program)0x0) && ((this->m_Config).LeakChecking != false)) {
    LOCK();
    pCVar1 = &(this->m_ObjectTracker).m_Programs;
    (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i =
         (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clLinkProgram",*errcode_ret,(cl_event *)0x0,(cl_sync_point_khr *)0x0,
               "returned %p",program);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    local_50._0_8_ = local_50 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
    CLIntercept::chromeCallLoggingExit(this,"clLinkProgram",(string *)local_50,false,0,local_80,end)
    ;
    if ((undefined1 *)local_50._0_8_ != local_50 + 0x10) {
      operator_delete((void *)local_50._0_8_);
    }
  }
  local_50._0_8_ = program;
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)&this->m_Mutex);
  if (iVar6 == 0) {
    pmVar8 = std::
             map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
             ::operator[](&this->m_ProgramInfoMap,(key_type *)local_50);
    uVar2 = this->m_ProgramNumber;
    pmVar8->ProgramNumber = uVar2;
    pmVar8->CompileCount = 0;
    this->m_ProgramNumber = uVar2 + 1;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
    if (((((this->m_Config).BuildLogging != false) ||
         ((this->m_Config).KernelNameHashTracking != false)) ||
        (((this->m_Config).DumpProgramSource != false ||
         ((((((this->m_Config).DumpInputProgramBinaries != false ||
             ((this->m_Config).DumpProgramBinaries != false)) ||
            ((this->m_Config).DumpProgramSPIRV != false)) ||
           (((this->m_Config).DumpProgramBuildLogs != false ||
            ((this->m_Config).DumpKernelISABinaries != false)))) ||
          ((this->m_Config).InjectProgramSource != false)))))) ||
       (((this->m_Config).AutoCreateSPIRV != false ||
        (bVar5 = 0, (this->m_Config).AubCaptureUniqueKernels == true)))) {
      CLIntercept::saveProgramOptionsHash(this,program,options_00);
      bVar5 = (this->m_Config).DumpProgramSource;
    }
    if (((((bVar5 & 1) == 0) && ((this->m_Config).DumpInputProgramBinaries == false)) &&
        ((this->m_Config).DumpProgramBinaries == false)) &&
       ((this->m_Config).DumpProgramSPIRV != true)) {
      if ((local_8c._0_1_ == false) &&
         (((this->m_Config).SimpleDumpProgramSource != false ||
          ((this->m_Config).DumpProgramSourceScript == true)))) {
        if (local_98 != (char *)0x0) {
          options_00 = local_98;
        }
        CLIntercept::dumpProgramOptionsScript(this,program,options_00);
      }
    }
    else {
      if (local_98 != (char *)0x0) {
        options_00 = local_98;
      }
      CLIntercept::dumpProgramOptions(this,program,local_8c._0_1_,0,1,options_00);
    }
    if ((this->m_Config).DumpProgramBinaries == true) {
      CLIntercept::dumpProgramBinary(this,program);
    }
    if ((this->m_Config).DumpKernelISABinaries == true) {
      CLIntercept::dumpKernelISABinaries(this,program);
    }
    if ((program != (cl_program)0x0) &&
       (((((this->m_Config).BuildLogging != false ||
          ((this->m_Config).KernelNameHashTracking != false)) ||
         (((this->m_Config).InjectProgramSource != false ||
          ((((this->m_Config).DumpProgramSourceScript != false ||
            ((this->m_Config).DumpProgramSource != false)) ||
           ((this->m_Config).DumpProgramBinaries != false)))))) ||
        ((((this->m_Config).DumpProgramSPIRV != false ||
          ((this->m_Config).DumpProgramBuildLogs != false)) ||
         (((this->m_Config).DumpKernelISABinaries != false ||
          (((this->m_Config).AutoCreateSPIRV != false ||
           ((this->m_Config).AubCaptureUniqueKernels == true)))))))))) {
      CLIntercept::incrementProgramCompileCount(this,program);
    }
    if (local_98 != (char *)0x0) {
      operator_delete__(local_98);
    }
    return program;
  }
  uVar9 = std::__throw_system_error(iVar6);
  if ((cl_program)local_50._0_8_ != p_Var12) {
    operator_delete((void *)local_50._0_8_);
  }
  _Unwind_Resume(uVar9);
}

Assistant:

CL_API_ENTRY cl_program CL_API_CALL CLIRN(clLinkProgram)(
    cl_context context,
    cl_uint num_devices,
    const cl_device_id* device_list,
    const char* options,
    cl_uint num_input_programs,
    const cl_program* input_programs,
    void (CL_CALLBACK *pfn_notify)(cl_program program, void* user_data),
    void* user_data,
    cl_int* errcode_ret )
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->dispatch().clLinkProgram )
    {
        GET_ENQUEUE_COUNTER();

        const bool isCompile = false;
        const bool isLink = true;
        char*   newOptions = NULL;

        PROGRAM_LINK_OPTIONS_OVERRIDE_INIT( num_devices, device_list, options, newOptions );

        CALL_LOGGING_ENTER( "context = %p, num_input_programs = %u, pfn_notify = %p",
            context,
            num_input_programs,
            pfn_notify );
        CHECK_ERROR_INIT( errcode_ret );
        BUILD_LOGGING_INIT();
        HOST_PERFORMANCE_TIMING_START();

        cl_program  retVal = NULL;

        if( newOptions != NULL )
        {
            retVal = pIntercept->dispatch().clLinkProgram(
                context,
                num_devices,
                device_list,
                newOptions,
                num_input_programs,
                input_programs,
                pfn_notify,
                user_data,
                errcode_ret );
        }

        if( retVal == NULL )
        {
            retVal = pIntercept->dispatch().clLinkProgram(
                context,
                num_devices,
                device_list,
                options,
                num_input_programs,
                input_programs,
                pfn_notify,
                user_data,
                errcode_ret );
        }

        HOST_PERFORMANCE_TIMING_END();
        CHECK_ERROR( errcode_ret[0] );
        BUILD_LOGGING( retVal, num_devices, device_list );
        ADD_OBJECT_ALLOCATION( retVal );
        CALL_LOGGING_EXIT( errcode_ret[0], "returned %p", retVal );

        // TODO: How do we compute a hash for the linked program?
        // This is a new program object, so we don't currently have a hash for it.
        SAVE_PROGRAM_NUMBER( retVal );
        SAVE_PROGRAM_OPTIONS_HASH( retVal, options );
        DUMP_PROGRAM_OPTIONS( retVal, newOptions ? newOptions : options, isCompile, isLink );
        DUMP_OUTPUT_PROGRAM_BINARIES( retVal );
        DUMP_KERNEL_ISA_BINARIES( retVal );
        INCREMENT_PROGRAM_COMPILE_COUNT( retVal );
        PROGRAM_OPTIONS_CLEANUP( newOptions );

        return retVal;
    }

    NULL_FUNCTION_POINTER_SET_ERROR_RETURN_NULL(errcode_ret, CL_INVALID_CONTEXT);
}